

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

kvtree * kvtree_set_kv_int(kvtree *hash,char *key,int val)

{
  kvtree *pkVar1;
  undefined4 in_register_00000014;
  char tmp [100];
  char acStack_88 [112];
  
  sprintf(acStack_88,"%d",CONCAT44(in_register_00000014,val));
  pkVar1 = kvtree_set_kv(hash,key,acStack_88);
  return pkVar1;
}

Assistant:

kvtree* kvtree_set_kv_int(kvtree* hash, const char* key, int val)
{
  /* TODO: this feels kludgy, but I guess as long as the ASCII string
   * is longer than a max int (or minimum int with leading minus sign)
   * which is 11 chars, we're ok ("-2147483648" to "2147483647") */
  char tmp[100];
  sprintf(tmp, "%d", val);
  return kvtree_set_kv(hash, key, tmp);
}